

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMPrintFilter.cpp
# Opt level: O3

FilterAction __thiscall DOMPrintFilter::acceptNode(DOMPrintFilter *this,DOMNode *node)

{
  char cVar1;
  int iVar2;
  FilterAction FVar3;
  undefined4 extraout_var;
  wchar16 *pwVar4;
  
  iVar2 = (*(this->super_DOMLSSerializerFilter).super_DOMNodeFilter._vptr_DOMNodeFilter[3])();
  cVar1 = (**(code **)(*(long *)node + 0x20))(node);
  FVar3 = FILTER_ACCEPT;
  if ((CONCAT44(extraout_var,iVar2) & (long)(1 << (cVar1 - 1U & 0x1f))) != 0) {
    iVar2 = (**(code **)(*(long *)node + 0x20))(node);
    FVar3 = FILTER_REJECT;
    if ((2 < iVar2 - 8U) && (iVar2 != 3)) {
      if (iVar2 == 1) {
        pwVar4 = (wchar16 *)(**(code **)(*(long *)node + 0x10))(node);
        iVar2 = xercesc_4_0::XMLString::compareString(pwVar4,L"person");
        if (iVar2 == 0) {
          FVar3 = FILTER_SKIP;
        }
        else {
          pwVar4 = (wchar16 *)(**(code **)(*(long *)node + 0x10))(node);
          iVar2 = xercesc_4_0::XMLString::compareString(pwVar4,L"link");
          FVar3 = (iVar2 == 0) + FILTER_ACCEPT;
        }
      }
      else {
        FVar3 = FILTER_ACCEPT;
      }
    }
  }
  return FVar3;
}

Assistant:

DOMNodeFilter::FilterAction DOMPrintFilter::
acceptNode(const DOMNode* node) const
{
	//
	// The DOMLSSerializer shall call getWhatToShow() before calling
	// acceptNode(), to show nodes which are supposed to be
	// shown to this filter.
	//
	// REVISIT: In case the DOMLSSerializer does not follow the protocol,
	//          Shall the filter honour, or NOT, what it claims
	//          it is interested in ?
	//
	// The DOMLS specs does not specify that acceptNode() shall do
	// this way, or not, so it is up the implementation,
	// to skip the code below for the sake of performance ...
	//
	if ((getWhatToShow() & (1 << (node->getNodeType() - 1))) == 0)
		return DOMNodeFilter::FILTER_ACCEPT;

	switch (node->getNodeType())
	{
	case DOMNode::ELEMENT_NODE:
		{
			// for element whose name is "person", skip it
			if (XMLString::compareString(node->getNodeName(), element_person)==0)
				return DOMNodeFilter::FILTER_SKIP;
			// for element whose name is "line", reject it
			if (XMLString::compareString(node->getNodeName(), element_link)==0)
				return DOMNodeFilter::FILTER_REJECT;
			// for rest, accept it
			return DOMNodeFilter::FILTER_ACCEPT;

			break;
		}
	case DOMNode::COMMENT_NODE:
		{
			// the WhatToShow will make this no effect
			return DOMNodeFilter::FILTER_REJECT;
			break;
		}
	case DOMNode::TEXT_NODE:
		{
			// the WhatToShow will make this no effect
			return DOMNodeFilter::FILTER_REJECT;
			break;
		}
	case DOMNode::DOCUMENT_TYPE_NODE:
		{
			// even we say we are going to process document type,
			// we are not able be to see this node since
			// DOMLSSerializerImpl (a XercesC's default implementation
			// of DOMLSSerializer) will not pass DocumentType node to
			// this filter.
			//
			return DOMNodeFilter::FILTER_REJECT;  // no effect
			break;
		}
	case DOMNode::DOCUMENT_NODE:
		{
			// same as DOCUMENT_NODE
			return DOMNodeFilter::FILTER_REJECT;  // no effect
			break;
		}
	default :
		{
			return DOMNodeFilter::FILTER_ACCEPT;
			break;
		}
	}

	return DOMNodeFilter::FILTER_ACCEPT;
}